

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::onEvent(SessionState *this,string *string)

{
  Locker local_20;
  Locker l;
  string *string_local;
  SessionState *this_local;
  
  if (this->m_pLog != (Log *)0x0) {
    l.m_mutex = (Mutex *)string;
    Locker::Locker(&local_20,&this->m_mutex);
    (*this->m_pLog->_vptr_Log[6])(this->m_pLog,l.m_mutex);
    Locker::~Locker(&local_20);
  }
  return;
}

Assistant:

void onEvent(const std::string &string) {
    if (!m_pLog) {
      return;
    }
    Locker l(m_mutex);
    m_pLog->onEvent(string);
  }